

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementBeamIGA.cpp
# Opt level: O1

void __thiscall chrono::fea::ChElementBeamIGA::ComputeNF(ChElementBeamIGA *this)

{
  ChVectorDynamic<> *in_RCX;
  double *in_RDX;
  ChVectorDynamic<> *in_RSI;
  ChVectorDynamic<> *in_R8;
  ChVectorDynamic<> *in_R9;
  double in_XMM0_Qa;
  
  ComputeNF((ChElementBeamIGA *)
            &this[-1].strain_k.
             super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
             ._M_impl.super__Vector_impl_data._M_finish,in_XMM0_Qa,in_RSI,in_RDX,in_RCX,in_R8,in_R9)
  ;
  return;
}

Assistant:

void ChElementBeamIGA::ComputeNF(const double U,
                                 ChVectorDynamic<>& Qi,
                                 double& detJ,
                                 const ChVectorDynamic<>& F,
                                 ChVectorDynamic<>* state_x,
                                 ChVectorDynamic<>* state_w) {
    // get two values of absyssa at extreme of span
    double u1 = knots(order);
    double u2 = knots(knots.size() - order - 1);

    double c1 = (u2 - u1) / 2;
    double c2 = (u2 + u1) / 2;

    // absyssa in span range:
    double u = (c1 * U + c2);

    // compute the basis functions N(u) at given u:
    int nspan = order;

    ChMatrixDynamic<> N(2, (int)nodes.size());  // row n.0 contains N, row n.1 contains dN/du

    geometry::ChBasisToolsBspline::BasisEvaluateDeriv(this->order, nspan, u, knots,
                                                      N);  ///< h

    ChVector<> dr0;
    for (int i = 0; i < nodes.size(); ++i) {
        dr0 += nodes[i]->GetX0ref().coord.pos * N(1, i);
    }
    detJ = dr0.Length() * c1;

    for (int i = 0; i < nodes.size(); ++i) {
        int stride = i * 6;
        Qi(stride + 0) = N(i) * F(0);
        Qi(stride + 1) = N(i) * F(1);
        Qi(stride + 2) = N(i) * F(2);
        Qi(stride + 3) = N(i) * F(3);
        Qi(stride + 4) = N(i) * F(4);
        Qi(stride + 5) = N(i) * F(5);
    }
}